

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setbyhandle(HSQUIRRELVM v,SQInteger idx,HSQMEMBERHANDLE *handle)

{
  SQObjectPtr *obj;
  SQRESULT SVar1;
  SQObjectPtr *in_RDX;
  HSQMEMBERHANDLE *in_RSI;
  SQObjectPtr *in_RDI;
  SQObjectPtr *val;
  SQObjectPtr *newval;
  SQObjectPtr *self;
  SQInteger in_stack_ffffffffffffffc8;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  HSQUIRRELVM in_stack_fffffffffffffff8;
  
  obj = stack_get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  stack_get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  SVar1 = _getmemberbyhandle(in_stack_fffffffffffffff8,in_RDI,in_RSI,(SQObjectPtr **)in_RDX);
  if (SVar1 < 0) {
    SVar1 = -1;
  }
  else {
    SQObjectPtr::operator=(in_RDX,obj);
    SQVM::Pop((SQVM *)0x11ac75);
    SVar1 = 0;
  }
  return SVar1;
}

Assistant:

SQRESULT sq_setbyhandle(HSQUIRRELVM v,SQInteger idx,const HSQMEMBERHANDLE *handle)
{
    SQObjectPtr &self = stack_get(v,idx);
    SQObjectPtr &newval = stack_get(v,-1);
    SQObjectPtr *val = NULL;
    if(SQ_FAILED(_getmemberbyhandle(v,self,handle,val))) {
        return SQ_ERROR;
    }
    *val = newval;
    v->Pop();
    return SQ_OK;
}